

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O1

void __thiscall Args::CmdLine::addArg(CmdLine *this,ArgIface *arg)

{
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *puVar1;
  __normal_iterator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  _Var2;
  logic_error *plVar3;
  long *plVar4;
  ulong *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ulong *local_a8;
  long local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  uint *local_88;
  undefined8 local_80;
  uint local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (arg == (ArgIface *)0x0) {
    plVar3 = (logic_error *)__cxa_allocate_exception(0x30);
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Attempt to add nullptr to the command line as argument.","");
    std::logic_error::logic_error(plVar3,"Please use desc() method of the exception.");
    *(undefined ***)plVar3 = &PTR__BaseException_001399b8;
    *(logic_error **)(plVar3 + 0x10) = plVar3 + 0x20;
    if (local_88 == &local_78) {
      *(uint *)(plVar3 + 0x20) = local_78;
      *(undefined4 *)(plVar3 + 0x24) = uStack_74;
      *(undefined4 *)(plVar3 + 0x28) = uStack_70;
      *(undefined4 *)(plVar3 + 0x2c) = uStack_6c;
    }
    else {
      *(uint **)(plVar3 + 0x10) = local_88;
      *(ulong *)(plVar3 + 0x20) = CONCAT44(uStack_74,local_78);
    }
    *(undefined8 *)(plVar3 + 0x18) = local_80;
    local_80 = 0;
    local_78 = local_78 & 0xffffff00;
    local_88 = &local_78;
    __cxa_throw(plVar3,&BaseException::typeinfo,BaseException::~BaseException);
  }
  local_c8._M_dataplus._M_p._0_1_ = '\0';
  local_c8._M_string_length = (size_type)arg;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const>>
                    ((this->m_args).
                     super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_args).
                     super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  puVar1 = (this->m_args).
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((ArgIface *)local_c8._M_string_length != (ArgIface *)0x0) &&
     ((char)local_c8._M_dataplus._M_p == '\x01')) {
    (*(*(_func_int ***)local_c8._M_string_length)[1])();
  }
  if (_Var2._M_current == puVar1) {
    (*arg->_vptr_ArgIface[0x12])(arg,this);
    local_c8._M_dataplus._M_p._0_1_ = '\0';
    local_c8._M_string_length = (size_type)arg;
    std::
    vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>
    ::emplace_back<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>
              ((vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>
                *)&this->m_args,
               (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)&local_c8);
    if (((ArgIface *)local_c8._M_string_length != (ArgIface *)0x0) &&
       ((char)local_c8._M_dataplus._M_p == '\x01')) {
      (*(*(_func_int ***)local_c8._M_string_length)[1])();
    }
    return;
  }
  plVar3 = (logic_error *)__cxa_allocate_exception(0x30);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Argument \"","");
  (*arg->_vptr_ArgIface[3])(&local_48,arg);
  std::operator+(&local_c8,&local_68,&local_48);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_a8 = (ulong *)*plVar4;
  puVar5 = (ulong *)(plVar4 + 2);
  if (local_a8 == puVar5) {
    local_98 = *puVar5;
    uStack_90 = plVar4[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar5;
  }
  local_a0 = plVar4[1];
  *plVar4 = (long)puVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::logic_error::logic_error(plVar3,"Please use desc() method of the exception.");
  *(undefined ***)plVar3 = &PTR__BaseException_001399b8;
  *(logic_error **)(plVar3 + 0x10) = plVar3 + 0x20;
  if (local_a8 == &local_98) {
    *(undefined4 *)(plVar3 + 0x20) = (undefined4)local_98;
    *(undefined4 *)(plVar3 + 0x24) = local_98._4_4_;
    *(undefined4 *)(plVar3 + 0x28) = (undefined4)uStack_90;
    *(undefined4 *)(plVar3 + 0x2c) = uStack_90._4_4_;
  }
  else {
    *(ulong **)(plVar3 + 0x10) = local_a8;
    *(ulong *)(plVar3 + 0x20) = local_98;
  }
  *(long *)(plVar3 + 0x18) = local_a0;
  local_a0 = 0;
  local_98 = local_98 & 0xffffffffffffff00;
  local_a8 = &local_98;
  __cxa_throw(plVar3,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

inline void
CmdLine::addArg( ArgIface * arg )
{
	if( arg )
	{
		if( std::find( m_args.begin(), m_args.end(),
			ArgPtr( arg, details::Deleter< ArgIface > ( false ) ) ) ==
				m_args.end() )
		{
			arg->setCmdLine( this );

			m_args.push_back( ArgPtr( arg,
				details::Deleter< ArgIface > ( false ) ) );
		}
		else
			throw BaseException( String( SL( "Argument \"" ) ) +
				arg->name() + SL( "\" already in the command line parser." ) );
	}
	else
		throw BaseException( String( SL( "Attempt to add nullptr to the "
			"command line as argument." ) ) );
}